

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int PHYSFS_eof(PHYSFS_File *handle)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  FileHandle *fh;
  
  uVar2 = 0;
  if ((*(char *)&handle[1].opaque != '\0') && (handle[6].opaque == handle[5].opaque)) {
    pvVar1 = handle->opaque;
    uVar3 = (**(code **)((long)pvVar1 + 0x28))(pvVar1);
    uVar4 = (**(code **)((long)pvVar1 + 0x30))(pvVar1);
    uVar2 = (uint)((long)uVar4 <= (long)uVar3 && -1 < (long)(uVar3 | uVar4));
  }
  return uVar2;
}

Assistant:

int PHYSFS_eof(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;

    if (!fh->forReading)  /* never EOF on files opened for write/append. */
        return 0;

    /* can't be eof if buffer isn't empty */
    if (fh->bufpos == fh->buffill)
    {
        /* check the Io. */
        PHYSFS_Io *io = fh->io;
        const PHYSFS_sint64 pos = io->tell(io);
        const PHYSFS_sint64 len = io->length(io);
        if ((pos < 0) || (len < 0))
            return 0;  /* beats me. */
        return (pos >= len);
    } /* if */

    return 0;
}